

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

gboolean g_tree_lookup_extended
                   (GTree *tree,gconstpointer lookup_key,gpointer *orig_key,gpointer *value)

{
  GTreeNode *pGVar1;
  GTreeNode *node;
  gpointer *value_local;
  gpointer *orig_key_local;
  gconstpointer lookup_key_local;
  GTree *tree_local;
  
  pGVar1 = g_tree_find_node(tree,lookup_key);
  if (pGVar1 == (GTreeNode *)0x0) {
    tree_local._4_4_ = 0;
  }
  else {
    if (orig_key != (gpointer *)0x0) {
      *orig_key = pGVar1->key;
    }
    if (value != (gpointer *)0x0) {
      *value = pGVar1->value;
    }
    tree_local._4_4_ = 1;
  }
  return tree_local._4_4_;
}

Assistant:

gboolean g_tree_lookup_extended (GTree *tree,
        gconstpointer  lookup_key,
        gpointer      *orig_key,
        gpointer      *value)
{
    GTreeNode *node;

    g_return_val_if_fail (tree != NULL, FALSE);

    node = g_tree_find_node (tree, lookup_key);

    if (node)
    {
        if (orig_key)
            *orig_key = node->key;
        if (value)
            *value = node->value;
        return TRUE;
    }
    else
        return FALSE;
}